

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

tommy_trie_inplace_node *
trie_inplace_bucket_remove
          (tommy_uint_t shift,tommy_trie_inplace_node **let_ptr,tommy_trie_inplace_node *remove,
          tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node_struct *ptVar2;
  long in_FS_OFFSET;
  bool bVar3;
  tommy_trie_inplace_node_struct *local_58;
  tommy_trie_inplace_node *leaf;
  tommy_trie_inplace_node **leaf_let_ptr;
  tommy_trie_inplace_node *ptStack_40;
  int i;
  tommy_trie_inplace_node *node;
  tommy_trie_inplace_node *ptStack_30;
  tommy_key_t key_local;
  tommy_trie_inplace_node *remove_local;
  tommy_trie_inplace_node **let_ptr_local;
  tommy_trie_inplace_node *ptStack_18;
  tommy_uint_t shift_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptStack_40 = *let_ptr;
  remove_local = (tommy_trie_inplace_node *)let_ptr;
  let_ptr_local._4_4_ = shift;
  while( true ) {
    bVar3 = false;
    if (ptStack_40 != (tommy_trie_inplace_node *)0x0) {
      bVar3 = ptStack_40->key != key;
    }
    if (!bVar3) break;
    remove_local = (tommy_trie_inplace_node *)
                   (ptStack_40->map + (key >> ((byte)let_ptr_local._4_4_ & 0x1f) & 3));
    ptStack_40 = remove_local->next;
    let_ptr_local._4_4_ = let_ptr_local._4_4_ - 2;
  }
  if (ptStack_40 == (tommy_trie_inplace_node *)0x0) {
    ptStack_18 = (tommy_trie_inplace_node *)0x0;
  }
  else {
    ptStack_30 = remove;
    if (remove == (tommy_trie_inplace_node *)0x0) {
      ptStack_30 = ptStack_40;
    }
    tommy_trie_inplace_list_remove(&remove_local->next,ptStack_30);
    if (remove_local->next == ptStack_40) {
      ptStack_18 = ptStack_30;
    }
    else if (remove_local->next == (tommy_trie_inplace_node_struct *)0x0) {
      leaf = (tommy_trie_inplace_node *)0x0;
      local_58 = ptStack_30;
      leaf_let_ptr._4_4_ = 3;
      while (-1 < leaf_let_ptr._4_4_) {
        if (local_58->map[leaf_let_ptr._4_4_] == (tommy_trie_inplace_node_struct *)0x0) {
          leaf_let_ptr._4_4_ = leaf_let_ptr._4_4_ + -1;
        }
        else {
          leaf = (tommy_trie_inplace_node *)(local_58->map + leaf_let_ptr._4_4_);
          local_58 = leaf->next;
          leaf_let_ptr._4_4_ = 3;
        }
      }
      if (leaf == (tommy_trie_inplace_node *)0x0) {
        ptStack_18 = ptStack_30;
      }
      else {
        leaf->next = (tommy_trie_inplace_node_struct *)0x0;
        for (leaf_let_ptr._4_4_ = 0; leaf_let_ptr._4_4_ < 4;
            leaf_let_ptr._4_4_ = leaf_let_ptr._4_4_ + 1) {
          local_58->map[leaf_let_ptr._4_4_] = ptStack_30->map[leaf_let_ptr._4_4_];
        }
        remove_local->next = local_58;
        ptStack_18 = ptStack_30;
      }
    }
    else {
      ptVar2 = remove_local->next;
      for (leaf_let_ptr._4_4_ = 0; leaf_let_ptr._4_4_ < 4;
          leaf_let_ptr._4_4_ = leaf_let_ptr._4_4_ + 1) {
        ptVar2->map[leaf_let_ptr._4_4_] = ptStack_30->map[leaf_let_ptr._4_4_];
      }
      ptStack_18 = ptStack_30;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ptStack_18;
  }
  __stack_chk_fail();
}

Assistant:

static tommy_trie_inplace_node* trie_inplace_bucket_remove(tommy_uint_t shift, tommy_trie_inplace_node** let_ptr, tommy_trie_inplace_node* remove, tommy_key_t key)
{
	tommy_trie_inplace_node* node;
	int i;
	tommy_trie_inplace_node** leaf_let_ptr;
	tommy_trie_inplace_node* leaf;

	node = *let_ptr;
	while (node && node->key != key) {
		let_ptr = &node->map[(key >> shift) & TOMMY_TRIE_INPLACE_TREE_MASK];
		node = *let_ptr;
		shift -= TOMMY_TRIE_INPLACE_TREE_BIT;
	}

	if (!node)
		return 0;

	/* if the node to remove is not specified */
	if (!remove)
		remove = node; /* remove the first */

	tommy_trie_inplace_list_remove(let_ptr, remove);

	/* if not change in the node, nothing more to do */
	if (*let_ptr == node)
		return remove;

	/* if we have a substitute */
	if (*let_ptr != 0) {
		/* copy the child pointers to the new one */
		node = *let_ptr;
		for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
			node->map[i] = remove->map[i];

		return remove;
	}

	/* find a leaf */
	leaf_let_ptr = 0;
	leaf = remove;

	/* search backward, statistically we have more zeros than ones */
	i = TOMMY_TRIE_INPLACE_TREE_MAX - 1;
	while (i >= 0) {
		if (leaf->map[i]) {
			leaf_let_ptr = &leaf->map[i];
			leaf = *leaf_let_ptr;
			i = TOMMY_TRIE_INPLACE_TREE_MAX - 1;
			continue;
		}
		--i;
	}

	/* if it's itself a leaf */
	if (!leaf_let_ptr)
		return remove;

	/* remove the leaf */
	*leaf_let_ptr = 0;

	/* copy the child pointers */
	for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
		leaf->map[i] = remove->map[i];

	/* put it in place */
	*let_ptr = leaf;

	return remove;
}